

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gz_zero(gz_statep state,off_t len)

{
  bool bVar1;
  int iVar2;
  uint local_34;
  z_streamp strm;
  uint n;
  int first;
  off_t len_local;
  gz_statep state_local;
  
  if (((state->strm).avail_in != 0) && (iVar2 = gz_comp(state,0), iVar2 == -1)) {
    return -1;
  }
  bVar1 = true;
  _n = len;
  while( true ) {
    if (_n == 0) {
      return 0;
    }
    if (_n < (long)(ulong)state->size) {
      local_34 = (uint)_n;
    }
    else {
      local_34 = state->size;
    }
    if (bVar1) {
      memset(state->in,0,(ulong)local_34);
      bVar1 = false;
    }
    (state->strm).avail_in = local_34;
    (state->strm).next_in = state->in;
    (state->x).pos = (ulong)local_34 + (state->x).pos;
    iVar2 = gz_comp(state,0);
    if (iVar2 == -1) break;
    _n = _n - (ulong)local_34;
  }
  return -1;
}

Assistant:

local int gz_zero(gz_statep state, z_off64_t len) {
    int first;
    unsigned n;
    z_streamp strm = &(state->strm);

    /* consume whatever's left in the input buffer */
    if (strm->avail_in && gz_comp(state, Z_NO_FLUSH) == -1)
        return -1;

    /* compress len zeros (len guaranteed > 0) */
    first = 1;
    while (len) {
        n = GT_OFF(state->size) || (z_off64_t)state->size > len ?
            (unsigned)len : state->size;
        if (first) {
            memset(state->in, 0, n);
            first = 0;
        }
        strm->avail_in = n;
        strm->next_in = state->in;
        state->x.pos += n;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return -1;
        len -= n;
    }
    return 0;
}